

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

sunrealtype KINScSNorm(KINMem kin_mem,N_Vector v,N_Vector u)

{
  sunrealtype sVar1;
  
  N_VInv(kin_mem->kin_uscale,kin_mem->kin_vtemp1);
  N_VAbs(u,kin_mem->kin_vtemp2);
  N_VLinearSum(0x3ff0000000000000,0,kin_mem->kin_vtemp1,kin_mem->kin_vtemp2,kin_mem->kin_vtemp1);
  N_VDiv(v,kin_mem->kin_vtemp1);
  sVar1 = (sunrealtype)N_VMaxNorm(kin_mem->kin_vtemp1);
  return sVar1;
}

Assistant:

static sunrealtype KINScSNorm(KINMem kin_mem, N_Vector v, N_Vector u)
{
  sunrealtype length;

  N_VInv(kin_mem->kin_uscale, kin_mem->kin_vtemp1);
  N_VAbs(u, kin_mem->kin_vtemp2);
  N_VLinearSum(ONE, kin_mem->kin_vtemp1, ONE, kin_mem->kin_vtemp2,
               kin_mem->kin_vtemp1);
  N_VDiv(v, kin_mem->kin_vtemp1, kin_mem->kin_vtemp1);

  length = N_VMaxNorm(kin_mem->kin_vtemp1);

  return (length);
}